

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

Matrix6x1 * __thiscall
iDynTree::BerdyHelper::getBiasTermJointAccelerationPropagation
          (Matrix6x1 *__return_storage_ptr__,BerdyHelper *this,IJointConstPtr joint,
          LinkIndex parentLinkIdx,LinkIndex childLinkIdx,Transform *child_X_parent)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Rotation *pRVar4;
  Position *pPVar5;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Twist relJointVelInMixed;
  Position parent_o_child;
  Rotation child_R_parent;
  SpatialMotionVector ret;
  SpatialMotionVector Smixed;
  Transform mixed_X_leftTrivialized;
  Rotation parent_R_child;
  Transform parent_X_child;
  double local_2e8;
  double local_2e0;
  double dStack_2d8;
  double local_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  double local_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double dStack_268;
  double local_260;
  double dStack_258;
  double local_250;
  double local_248;
  double dStack_240;
  double local_238;
  SpatialMotionVector local_228;
  SpatialMotionVector local_1f8;
  Twist local_1c8 [48];
  Twist local_198 [48];
  Transform local_168 [48];
  SpatialMotionVector local_138 [2];
  Rotation local_d8 [168];
  
  __return_storage_ptr__->m_data[4] = 0.0;
  __return_storage_ptr__->m_data[5] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  lVar3 = iDynTree::LinkVelArray::operator()(&this->m_linkVels,parentLinkIdx);
  local_2a8 = *(double *)(lVar3 + 0x18);
  uStack_2a0 = 0;
  local_2b8 = *(double *)(lVar3 + 0x20);
  dStack_2b0 = *(double *)(lVar3 + 0x28);
  pRVar4 = (Rotation *)iDynTree::Transform::getRotation();
  iDynTree::Rotation::Rotation((Rotation *)&local_278,pRVar4);
  iDynTree::Transform::inverse();
  pPVar5 = (Position *)iDynTree::Transform::getPosition();
  iDynTree::Position::Position((Position *)&local_290,pPVar5);
  pRVar4 = (Rotation *)iDynTree::Transform::getRotation();
  iDynTree::Rotation::Rotation(local_d8,pRVar4);
  iDynTree::Position::Zero();
  iDynTree::Transform::Transform((Transform *)local_138,local_d8,(Position *)&local_2e8);
  local_228.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] =
       0.0;
  local_228.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] =
       0.0;
  local_228.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       0.0;
  local_228.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] =
       0.0;
  local_228.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       0.0;
  local_228.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       0.0;
  iDynTree::Twist::Twist((Twist *)&local_2e8,&local_228);
  iVar1 = (**(code **)(*(long *)joint + 0x20))(joint);
  if (iVar1 != 0) {
    uVar7 = 0;
    do {
      (**(code **)(*(long *)joint + 0x60))
                (&local_228,joint,uVar7 & 0xffffffff,childLinkIdx,parentLinkIdx);
      iDynTree::Transform::operator*(local_168,local_138);
      lVar3 = (**(code **)(*(long *)joint + 0xc0))(joint);
      pdVar6 = (double *)
               iDynTree::VectorDynSize::operator()((VectorDynSize *)&this->m_jointVel,lVar3 + uVar7)
      ;
      iDynTree::SpatialMotionVector::operator*(&local_1f8,*pdVar6);
      iDynTree::Twist::Twist(local_1c8,&local_1f8);
      iDynTree::Twist::operator+(local_198,(Twist *)&local_2e8);
      iDynTree::Twist::operator=((Twist *)&local_2e8,local_198);
      uVar7 = uVar7 + 1;
      uVar2 = (**(code **)(*(long *)joint + 0x20))(joint);
    } while (uVar7 < uVar2);
  }
  dVar8 = dStack_2d8 * local_2b8 - local_2e0 * dStack_2b0;
  dVar9 = local_2e8 * dStack_2b0 - dStack_2d8 * local_2a8;
  dVar10 = local_2a8 * local_2e0 - local_2e8 * local_2b8;
  dVar13 = local_2a8 * local_2c8 - local_2d0 * local_2b8;
  dVar17 = dStack_2b0 * local_290 + dStack_280 * -local_2a8;
  dVar18 = local_2a8 * local_288 + -local_2b8 * local_290;
  dVar19 = local_2b8 * dStack_280 + -dStack_2b0 * local_288;
  dVar16 = local_2a8 * dVar17 - dVar19 * local_2b8;
  dVar11 = dVar10 * (dStack_268 + dStack_268) +
           (dStack_270 + dStack_270) * dVar9 + (local_278 + local_278) * dVar8;
  dVar12 = dVar10 * (local_250 + local_250) +
           (dStack_258 + dStack_258) * dVar9 + (local_260 + local_260) * dVar8;
  dVar14 = dStack_2c0 * local_2b8 - local_2c8 * dStack_2b0;
  dVar15 = local_2d0 * dStack_2b0 - dStack_2c0 * local_2a8;
  dVar17 = local_2b8 * dVar18 - dVar17 * dStack_2b0;
  dVar18 = dStack_2b0 * dVar19 - dVar18 * local_2a8;
  dVar8 = (local_238 + local_238) * dVar10 +
          (dStack_240 + dStack_240) * dVar9 + (local_248 + local_248) * dVar8;
  __return_storage_ptr__->m_data[0] = dVar11;
  __return_storage_ptr__->m_data[1] = dVar12;
  __return_storage_ptr__->m_data[2] = dVar8;
  __return_storage_ptr__->m_data[3] = dVar13 * dStack_268 + dStack_270 * dVar15 + local_278 * dVar14
  ;
  __return_storage_ptr__->m_data[4] = dVar13 * local_250 + dStack_258 * dVar15 + local_260 * dVar14;
  __return_storage_ptr__->m_data[5] = dVar15 * dStack_240 + dVar14 * local_248 + local_238 * dVar13;
  __return_storage_ptr__->m_data[0] =
       dVar16 * dStack_268 + dStack_270 * dVar18 + local_278 * dVar17 + dVar11;
  __return_storage_ptr__->m_data[1] =
       dVar16 * local_250 + dStack_258 * dVar18 + local_260 * dVar17 + dVar12;
  __return_storage_ptr__->m_data[2] =
       dVar18 * dStack_240 + dVar17 * local_248 + local_238 * dVar16 + dVar8;
  return __return_storage_ptr__;
}

Assistant:

Matrix6x1 BerdyHelper::getBiasTermJointAccelerationPropagation(IJointConstPtr joint,
                                                               const LinkIndex parentLinkIdx,
                                                               const LinkIndex childLinkIdx,
                                                               const Transform &child_X_parent)
{
    Matrix6x1 biasTerm;
    biasTerm.zero();

    auto biasTermEig = toEigen(biasTerm);

    // Implementing equation 36 in https://www.sharelatex.com/project/59439ec80788901873a803fb
    Vector3 parentBodyAngularVel = m_linkVels(parentLinkIdx).getAngularVec3();

    Rotation  child_R_parent = child_X_parent.getRotation();
    Transform parent_X_child = child_X_parent.inverse();
    Position  parent_o_child = parent_X_child.getPosition();
    Rotation  parent_R_child = parent_X_child.getRotation();
    Transform mixed_X_leftTrivialized = Transform(parent_R_child, Position::Zero());

    // Compute the mixed relative velocity of the child w.r.t to the parent
    Twist relJointVelInMixed = Twist::Zero();
    for (size_t localDof=0; localDof < joint->getNrOfDOFs(); localDof++)
    {
        SpatialMotionVector SleftTrivialzed = joint->getMotionSubspaceVector(localDof, childLinkIdx, parentLinkIdx);
        SpatialMotionVector Smixed = mixed_X_leftTrivialized*SleftTrivialzed;

        relJointVelInMixed = relJointVelInMixed + (Smixed*m_jointVel(joint->getDOFsOffset()+localDof));
    }

    // Compute the first term
    biasTermEig.segment<3>(0) = 2*toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(relJointVelInMixed.getLinearVec3())));
    biasTermEig.segment<3>(3) = toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(relJointVelInMixed.getAngularVec3())));

    // Compute the second term
    biasTermEig.segment<3>(0) += toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(parentBodyAngularVel).cross(toEigen(parent_o_child))));

    return biasTerm;
}